

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fortran.c
# Opt level: O3

REF_STATUS
ref_fortran_init_(REF_INT *nnodes,REF_GLOB *nnodesg,REF_GLOB *l2g,REF_INT *part,REF_INT *partition,
                 REF_DBL *x,REF_DBL *y,REF_DBL *z)

{
  int iVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  int local_4c;
  int *local_48;
  REF_INT *local_40;
  REF_DBL *local_38;
  
  local_38 = x;
  uVar3 = ref_mpi_create(&ref_mpi);
  if (uVar3 == 0) {
    local_48 = nnodes;
    local_40 = part;
    uVar3 = ref_grid_create(&ref_grid,ref_mpi);
    if (uVar3 == 0) {
      ref_node = ref_grid->node;
      ref_mpi_stopwatch_start(ref_grid->mpi);
      iVar1 = ref_grid->mpi->id;
      if (*partition != iVar1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
               0x38,"ref_fortran_init_","processor ids do not match",(long)*partition,(long)iVar1);
        return 1;
      }
      uVar3 = ref_node_initialize_n_global(ref_node,*nnodesg);
      if (uVar3 == 0) {
        if (*local_48 < 1) {
          return 0;
        }
        lVar8 = 0;
        while (uVar3 = ref_node_add(ref_node,l2g[lVar8] + -1,&local_4c), uVar3 == 0) {
          pRVar2 = ref_node->real;
          lVar4 = (long)local_4c;
          pRVar2[lVar4 * 0xf] = local_38[lVar8];
          pRVar2[lVar4 * 0xf + 1] = y[lVar8];
          pRVar2[lVar4 * 0xf + 2] = z[lVar8];
          ref_node->part[lVar4] = local_40[lVar8] + -1;
          lVar8 = lVar8 + 1;
          if (*local_48 <= lVar8) {
            return 0;
          }
        }
        uVar6 = (ulong)uVar3;
        pcVar7 = "add node";
        uVar5 = 0x3d;
      }
      else {
        uVar6 = (ulong)uVar3;
        pcVar7 = "init nnodesg";
        uVar5 = 0x3a;
      }
    }
    else {
      uVar6 = (ulong)uVar3;
      pcVar7 = "create grid";
      uVar5 = 0x32;
    }
  }
  else {
    uVar6 = (ulong)uVar3;
    pcVar7 = "create mpi";
    uVar5 = 0x31;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",uVar5,
         "ref_fortran_init_",uVar6,pcVar7);
  return (REF_STATUS)uVar6;
}

Assistant:

REF_STATUS REF_FORT_(ref_fortran_init,
                     REF_FORTRAN_INIT)(REF_INT *nnodes, REF_GLOB *nnodesg,
                                       REF_GLOB *l2g, REF_INT *part,
                                       REF_INT *partition, REF_DBL *x,
                                       REF_DBL *y, REF_DBL *z) {
  REF_NODE ref_node;
  REF_INT node, pos;
  RSS(ref_mpi_create(&ref_mpi), "create mpi");
  RSS(ref_grid_create(&ref_grid, ref_mpi), "create grid");
  ref_node = ref_grid_node(ref_grid);

  ref_mpi_stopwatch_start(ref_grid_mpi(ref_grid));

  REIS(*partition, ref_mpi_rank(ref_grid_mpi(ref_grid)),
       "processor ids do not match");

  RSS(ref_node_initialize_n_global(ref_node, *nnodesg), "init nnodesg");

  for (node = 0; node < (*nnodes); node++) {
    RSS(ref_node_add(ref_node, l2g[node] - 1, &pos), "add node");
    ref_node_xyz(ref_node, 0, pos) = x[node];
    ref_node_xyz(ref_node, 1, pos) = y[node];
    ref_node_xyz(ref_node, 2, pos) = z[node];
    ref_node_part(ref_node, pos) = part[node] - 1;
  }

  return REF_SUCCESS;
}